

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_daa_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint local_24;
  int eflags;
  int cf;
  int af;
  int al;
  int old_al;
  CPUX86State *env_local;
  
  uVar2 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar1 = (uint)env->regs[0];
  uVar3 = uVar1 & 0xff;
  local_24 = 0;
  if ((9 < (uVar1 & 0xf)) || (cf = uVar3, (uVar2 & 0x10) != 0)) {
    cf = uVar3 + 6 & 0xff;
    local_24 = 0x10;
  }
  if ((0x99 < uVar3) || ((uVar2 & 1) != 0)) {
    cf = cf + 0x60U & 0xff;
    local_24 = local_24 | 1;
  }
  env->regs[0] = env->regs[0] & 0xffffffffffffff00 | (long)cf;
  env->cc_src = (long)(int)(cf & 0x80U | (uint)"\x04"[cf] | (uint)(cf == 0) << 6 | local_24);
  return;
}

Assistant:

void helper_daa(CPUX86State *env)
{
    int old_al, al, af, cf;
    int eflags;

    eflags = cpu_cc_compute_all(env, CC_OP);
    cf = eflags & CC_C;
    af = eflags & CC_A;
    old_al = al = env->regs[R_EAX] & 0xff;

    eflags = 0;
    if (((al & 0x0f) > 9) || af) {
        al = (al + 6) & 0xff;
        eflags |= CC_A;
    }
    if ((old_al > 0x99) || cf) {
        al = (al + 0x60) & 0xff;
        eflags |= CC_C;
    }
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xff) | al;
    /* well, speed is not an issue here, so we compute the flags by hand */
    eflags |= (al == 0) << 6; /* zf */
    eflags |= parity_table[al]; /* pf */
    eflags |= (al & 0x80); /* sf */
    CC_SRC = eflags;
}